

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  RepeatedField<int> *this_01;
  LogFinisher local_6d;
  int value_local;
  LogMessage local_68;
  Extension *extension;
  
  value_local = value;
  bVar1 = MaybeNewExtension(this,number,descriptor,&extension);
  if (bVar1) {
    extension->type = type;
    CVar2 = anon_unknown_29::cpp_type(type);
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1d4);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_6d,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    extension->is_repeated = true;
    extension->is_packed = packed;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      this_01 = (RepeatedField<int> *)operator_new(0x10);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->rep_ = (Rep *)0x0;
    }
    else {
      this_01 = (RepeatedField<int> *)
                Arena::AllocateAligned(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      RepeatedField<int>::RepeatedField(this_01,this_00);
      Arena::AddListNode(this_00,this_01,arena_destruct_object<google::protobuf::RepeatedField<int>>
                        );
    }
    (extension->field_0).repeated_int32_value = this_01;
  }
  else {
    if (extension->is_repeated == false) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1da);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_6d,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    CVar2 = anon_unknown_29::cpp_type(extension->type);
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1da);
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_6d,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    if (extension->is_packed != packed) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1db);
      pLVar3 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_6d,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
  }
  RepeatedField<int>::Add((extension->field_0).repeated_int32_value,&value_local);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type,
                           bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}